

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O0

void __thiscall Node::Node(Node *this,NodeType type,Instruction *instruction,CallInst *callInst)

{
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Node_001cda58;
  iVar1 = lastId + 1;
  *(int *)(in_RDI + 1) = lastId;
  lastId = iVar1;
  *(undefined4 *)((long)in_RDI + 0xc) = in_ESI;
  in_RDI[2] = in_RDX;
  in_RDI[3] = in_RCX;
  std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::set
            ((set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)0x1868aa);
  std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::set
            ((set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)0x1868b7);
  return;
}

Assistant:

Node::Node(NodeType type, const Instruction *instruction,
           const CallInst *callInst)
        : id_(lastId++), nodeType_(type), llvmInstruction_(instruction),
          callInstruction_(callInst) {}